

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::CheckProgram(SACSubcaseBase *this,GLuint program)

{
  GLint program_00;
  size_type __n;
  reference pvVar1;
  allocator_type local_39;
  undefined1 local_38 [8];
  vector<char,_std::allocator<char>_> log;
  int local_18;
  GLint length;
  GLint status;
  GLuint program_local;
  SACSubcaseBase *this_local;
  
  length = program;
  _status = this;
  glu::CallLogWrapper::glGetProgramiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,0x8b82,
             &local_18);
  glu::CallLogWrapper::glGetProgramiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,length,0x8b84,
             (GLint *)&log.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14);
  if (1 < (int)log.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_) {
    __n = (size_type)(int)log.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_38,__n,&local_39);
    std::allocator<char>::~allocator(&local_39);
    program_00 = length;
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_38,0);
    glu::CallLogWrapper::glGetProgramInfoLog
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program_00,
               log.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,(GLsizei *)0x0,
               pvVar1);
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_38,0);
    anon_unknown_0::Output("%s\n",pvVar1);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_38);
  }
  return local_18 == 1;
}

Assistant:

bool CheckProgram(GLuint program)
	{
		GLint status;
		glGetProgramiv(program, GL_LINK_STATUS, &status);
		GLint length;
		glGetProgramiv(program, GL_INFO_LOG_LENGTH, &length);
		if (length > 1)
		{
			std::vector<GLchar> log(length);
			glGetProgramInfoLog(program, length, NULL, &log[0]);
			Output("%s\n", &log[0]);
		}
		return status == GL_TRUE;
	}